

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.cpp
# Opt level: O0

int __thiscall
llvm::MCRegisterInfo::getDwarfRegNumFromDwarfEHRegNum(MCRegisterInfo *this,uint RegNum)

{
  bool bVar1;
  uint *puVar2;
  MCRegister local_28;
  OptionalStorage<unsigned_int,_true> local_24;
  Optional<unsigned_int> LRegNum;
  uint RegNum_local;
  MCRegisterInfo *this_local;
  
  LRegNum.Storage.field_0.value = RegNum;
  unique0x10000089 = this;
  local_24 = (OptionalStorage<unsigned_int,_true>)getLLVMRegNum(this,RegNum,true);
  bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&local_24);
  if (bVar1) {
    puVar2 = Optional<unsigned_int>::operator*((Optional<unsigned_int> *)&local_24);
    MCRegister::MCRegister(&local_28,*puVar2);
    this_local._4_4_ = getDwarfRegNum(this,local_28,false);
  }
  else {
    this_local._4_4_ = LRegNum.Storage.field_0;
  }
  return this_local._4_4_;
}

Assistant:

int MCRegisterInfo::getDwarfRegNumFromDwarfEHRegNum(unsigned RegNum) const {
  // On ELF platforms, DWARF EH register numbers are the same as DWARF
  // other register numbers.  On Darwin x86, they differ and so need to be
  // mapped.  The .cfi_* directives accept integer literals as well as
  // register names and should generate exactly what the assembly code
  // asked for, so there might be DWARF/EH register numbers that don't have
  // a corresponding LLVM register number at all.  So if we can't map the
  // EH register number to an LLVM register number, assume it's just a
  // valid DWARF register number as is.
  if (Optional<unsigned> LRegNum = getLLVMRegNum(RegNum, true))
    return getDwarfRegNum(*LRegNum, false);
  return RegNum;
}